

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::try_connect_more_peers(session_impl *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  size_type sVar5;
  size_type sVar6;
  reference pvVar7;
  value_type *pptVar8;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_60;
  torrent *local_50;
  torrent *t;
  int local_40;
  int num_torrents;
  int steps_since_last_connect;
  vector<torrent_*> *want_peers_finished;
  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *local_28;
  vector<torrent_*> *want_peers_download;
  int local_18;
  int local_14;
  int limit;
  int max_connections;
  session_impl *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    _limit = this;
    iVar2 = num_connections(this);
    iVar3 = session_settings::get_int(&this->m_settings,0x4055);
    if (iVar2 < iVar3) {
      local_14 = session_settings::get_int(&this->m_settings,0x4012);
      if (0 < this->m_boost_connections) {
        if (local_14 < this->m_boost_connections) {
          this->m_boost_connections = this->m_boost_connections - local_14;
          local_14 = 0;
        }
        else {
          local_14 = local_14 - this->m_boost_connections;
          this->m_boost_connections = 0;
        }
      }
      if (0 < local_14) {
        iVar2 = session_settings::get_int(&this->m_settings,0x4055);
        iVar3 = num_connections(this);
        want_peers_download._4_4_ = iVar2 - iVar3;
        iVar2 = ::std::numeric_limits<int>::max();
        want_peers_download._0_4_ = iVar2 + -1;
        piVar4 = ::std::min<int>((int *)((long)&want_peers_download + 4),(int *)&want_peers_download
                                );
        local_18 = *piVar4;
        bVar1 = session_settings::get_bool(&this->m_settings,0x802c);
        if ((bVar1) && ((local_18 + 1) / 2 < local_14)) {
          local_14 = (local_18 + 1) / 2;
        }
        want_peers_finished._4_4_ = 2;
        local_28 = &container_wrapper<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>_>
                    ::operator[](&this->m_torrent_lists,
                                 (strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>)0x2)
                    ->
                    super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
        ;
        num_torrents = 3;
        _steps_since_last_connect =
             &container_wrapper<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>_>
              ::operator[](&this->m_torrent_lists,
                           (strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>)0x3)->
              super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>;
        bVar1 = ::std::
                vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
                empty(local_28);
        if (((!bVar1) ||
            (bVar1 = ::std::
                     vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                     ::empty(_steps_since_last_connect), !bVar1)) && (0 < local_14)) {
          local_40 = 0;
          sVar5 = ::std::
                  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
                  size(_steps_since_last_connect);
          sVar6 = ::std::
                  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
                  size(local_28);
          t._4_4_ = (int)sVar5 + (int)sVar6;
          do {
            iVar2 = this->m_next_downloading_connect_torrent;
            sVar5 = ::std::
                    vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                    ::size(local_28);
            if ((int)sVar5 <= iVar2) {
              this->m_next_downloading_connect_torrent = 0;
            }
            iVar2 = this->m_next_finished_connect_torrent;
            sVar5 = ::std::
                    vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                    ::size(_steps_since_last_connect);
            if ((int)sVar5 <= iVar2) {
              this->m_next_finished_connect_torrent = 0;
            }
            while( true ) {
              local_50 = (torrent *)0x0;
              bVar1 = ::std::
                      deque<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                      ::empty(&this->m_prio_torrents);
              if (((bVar1 ^ 0xffU) & 1) == 0) break;
              ::std::
              deque<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
              ::front(&this->m_prio_torrents);
              ::std::weak_ptr<libtorrent::aux::torrent>::lock
                        ((weak_ptr<libtorrent::aux::torrent> *)&local_60);
              local_50 = ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::
                         get(&local_60);
              ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                        ((shared_ptr<libtorrent::aux::torrent> *)&local_60);
              pvVar7 = ::std::
                       deque<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                       ::front(&this->m_prio_torrents);
              pvVar7->second = pvVar7->second + -1;
              pvVar7 = ::std::
                       deque<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                       ::front(&this->m_prio_torrents);
              if (((0 < pvVar7->second) && (local_50 != (torrent *)0x0)) &&
                 (bVar1 = torrent::want_peers(local_50), bVar1)) break;
              ::std::
              deque<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
              ::pop_front(&this->m_prio_torrents);
            }
            if (local_50 == (torrent *)0x0) {
              iVar2 = this->m_download_connect_attempts;
              iVar3 = session_settings::get_int(&this->m_settings,0x4072);
              if (((iVar3 <= iVar2) &&
                  (bVar1 = ::std::
                           vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                           ::empty(_steps_since_last_connect), !bVar1)) ||
                 (bVar1 = ::std::
                          vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                          ::empty(local_28), bVar1)) {
                pptVar8 = container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                          ::operator[]((container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                                        *)_steps_since_last_connect,
                                       this->m_next_finished_connect_torrent);
                local_50 = *pptVar8;
                this->m_download_connect_attempts = 0;
                this->m_next_finished_connect_torrent = this->m_next_finished_connect_torrent + 1;
              }
              else {
                pptVar8 = container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                          ::operator[]((container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                                        *)local_28,this->m_next_downloading_connect_torrent);
                local_50 = *pptVar8;
                this->m_download_connect_attempts = this->m_download_connect_attempts + 1;
                this->m_next_downloading_connect_torrent =
                     this->m_next_downloading_connect_torrent + 1;
              }
            }
            bVar1 = torrent::try_connect_peer(local_50);
            if (bVar1) {
              local_14 = local_14 + -1;
              local_40 = 0;
              counters::inc_stats_counter(&this->m_stats_counters,0x33,1);
            }
            local_40 = local_40 + 1;
            if (local_14 == 0) {
              return;
            }
            bVar1 = ::std::
                    vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                    ::empty(local_28);
            if ((bVar1) &&
               (bVar1 = ::std::
                        vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                        ::empty(_steps_since_last_connect), bVar1)) {
              return;
            }
            if (t._4_4_ + 1 < local_40) {
              return;
            }
            iVar2 = num_connections(this);
            iVar3 = session_settings::get_int(&this->m_settings,0x4055);
          } while (iVar2 < iVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void session_impl::try_connect_more_peers()
	{
		if (m_abort) return;

		if (num_connections() >= m_settings.get_int(settings_pack::connections_limit))
			return;

		// this is the maximum number of connections we will
		// attempt this tick
		int max_connections = m_settings.get_int(settings_pack::connection_speed);

		// this loop will "hand out" connection_speed to the torrents, in a round
		// robin fashion, so that every torrent is equally likely to connect to a
		// peer

		// boost connections are connections made by torrent connection
		// boost, which are done immediately on a tracker response. These
		// connections needs to be deducted from the regular connection attempt
		// quota for this tick
		if (m_boost_connections > 0)
		{
			if (m_boost_connections > max_connections)
			{
				m_boost_connections -= max_connections;
				max_connections = 0;
			}
			else
			{
				max_connections -= m_boost_connections;
				m_boost_connections = 0;
			}
		}

		// zero connections speeds are allowed, we just won't make any connections
		if (max_connections <= 0) return;

		// TODO: use a lower limit than m_settings.connections_limit
		// to allocate the to 10% or so of connection slots for incoming
		// connections
		// cap this at max - 1, since we may add one below
		int const limit = std::min(m_settings.get_int(settings_pack::connections_limit)
			- num_connections(), std::numeric_limits<int>::max() - 1);

		// this logic is here to smooth out the number of new connection
		// attempts over time, to prevent connecting a large number of
		// sockets, wait 10 seconds, and then try again
		if (m_settings.get_bool(settings_pack::smooth_connects) && max_connections > (limit+1) / 2)
			max_connections = (limit + 1) / 2;

		aux::vector<torrent*>& want_peers_download = m_torrent_lists[torrent_want_peers_download];
		aux::vector<torrent*>& want_peers_finished = m_torrent_lists[torrent_want_peers_finished];

		// if no torrent want any peers, just return
		if (want_peers_download.empty() && want_peers_finished.empty()) return;

		// if we don't have any connection attempt quota, return
		if (max_connections <= 0) return;

		int steps_since_last_connect = 0;
		int const num_torrents = int(want_peers_finished.size() + want_peers_download.size());
		for (;;)
		{
			if (m_next_downloading_connect_torrent >= int(want_peers_download.size()))
				m_next_downloading_connect_torrent = 0;

			if (m_next_finished_connect_torrent >= int(want_peers_finished.size()))
				m_next_finished_connect_torrent = 0;

			torrent* t = nullptr;
			// there are prioritized torrents. Pick one of those
			while (!m_prio_torrents.empty())
			{
				t = m_prio_torrents.front().first.lock().get();
				--m_prio_torrents.front().second;
				if (m_prio_torrents.front().second > 0
					&& t != nullptr
					&& t->want_peers()) break;
				m_prio_torrents.pop_front();
				t = nullptr;
			}

			if (t == nullptr)
			{
				if ((m_download_connect_attempts >= m_settings.get_int(
						settings_pack::connect_seed_every_n_download)
					&& !want_peers_finished.empty())
						|| want_peers_download.empty())
				{
					// pick a finished torrent to give a peer to
					t = want_peers_finished[m_next_finished_connect_torrent];
					TORRENT_ASSERT(t->want_peers_finished());
					m_download_connect_attempts = 0;
					++m_next_finished_connect_torrent;
				}
				else
				{
					// pick a downloading torrent to give a peer to
					t = want_peers_download[m_next_downloading_connect_torrent];
					TORRENT_ASSERT(t->want_peers_download());
					++m_download_connect_attempts;
					++m_next_downloading_connect_torrent;
				}
			}

			TORRENT_ASSERT(t->want_peers());
			TORRENT_ASSERT(!t->is_torrent_paused());

			if (t->try_connect_peer())
			{
				--max_connections;
				steps_since_last_connect = 0;
				m_stats_counters.inc_stats_counter(counters::connection_attempts);
			}

			++steps_since_last_connect;

			// if there are no more free connection slots, abort
			if (max_connections == 0) return;
			// there are no more torrents that want peers
			if (want_peers_download.empty() && want_peers_finished.empty()) break;
			// if we have gone a whole loop without
			// handing out a single connection, break
			if (steps_since_last_connect > num_torrents + 1) break;
			// maintain the global limit on number of connections
			if (num_connections() >= m_settings.get_int(settings_pack::connections_limit)) break;
		}
	}